

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::Set_partition_iterator
          (Set_partition_iterator *this,uint *n,uint *k)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  allocator_type local_3f;
  allocator_type local_3e;
  allocator_type local_3d;
  uint i;
  uint local_38;
  value_type_conflict3 local_34;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->value_,(ulong)*k,&local_3d);
  local_34 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->rgs_,(ulong)*n,&local_34,&local_3e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->max_,(ulong)(*n + 1),&local_3f);
  uVar1 = *n;
  this->is_end_ = uVar1 == 0;
  this->n_ = uVar1;
  this->k_ = *k;
  *(this->max_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xffffffff;
  local_38 = 0;
  while( true ) {
    uVar4 = *n;
    i = uVar4 - *k;
    if (i < local_38) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((this->value_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,&local_38);
    local_38 = local_38 + 1;
  }
  uVar5 = 1;
  while (i = i + 1, i < uVar4) {
    (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[i] = uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((this->value_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,&i);
    uVar5 = uVar5 + 1;
    uVar4 = *n;
  }
  puVar2 = (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->max_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  while (uVar6 = uVar5 + 1, uVar6 <= uVar4) {
    puVar3[uVar6] = puVar2[uVar5] + 1;
    uVar5 = uVar6;
    uVar4 = *n;
  }
  update_value(this);
  return;
}

Assistant:

Set_partition_iterator(const uint& n, const uint& k)
      : value_(k), rgs_(n, 0), max_(n + 1), is_end_(n == 0), n_(n), k_(k) {
    max_[0] = std::numeric_limits<uint>::max();
    for (uint i = 0; i <= n - k; ++i) value_[0].push_back(i);
    for (uint i = n - k + 1, j = 1; i < n; ++i, ++j) {
      rgs_[i] = j;
      value_[j].push_back(i);
    }
    for (uint i = 1; i <= n; i++) max_[i] = rgs_[i - 1] + 1;
    update_value();
  }